

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O3

uchar lua_sj_get_byte(uint address)

{
  uchar uVar1;
  int iVar2;
  
  iVar2 = addLuaSourcePositions();
  uVar1 = MemGetByte(address);
  if (iVar2 != 0) {
    sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
    super__Vector_impl_data._M_finish =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish + (-1 - (ulong)(iVar2 - 1));
  }
  return uVar1;
}

Assistant:

static unsigned char lua_sj_get_byte(unsigned int address) {
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	auto result = MemGetByte(address);
	removeLuaSourcePositions(positionsAdded);
	return result;
}